

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_fir_filter.cc
# Opt level: O0

void __thiscall
webrtc::SparseFIRFilter::Filter(SparseFIRFilter *this,float *in,size_t length,float *out)

{
  float fVar1;
  size_type sVar2;
  reference pvVar3;
  const_reference pvVar4;
  size_type sVar5;
  reference __src;
  bool bVar6;
  ulong local_38;
  size_t j;
  size_t i;
  float *out_local;
  size_t length_local;
  float *in_local;
  SparseFIRFilter *this_local;
  
  for (j = 0; j < length; j = j + 1) {
    out[j] = 0.0;
    local_38 = 0;
    while( true ) {
      bVar6 = false;
      if (local_38 * this->sparsity_ + this->offset_ <= j) {
        sVar2 = std::vector<float,_std::allocator<float>_>::size(&this->nonzero_coeffs_);
        bVar6 = local_38 < sVar2;
      }
      if (!bVar6) break;
      fVar1 = in[(j - local_38 * this->sparsity_) - this->offset_];
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&this->nonzero_coeffs_,local_38);
      out[j] = fVar1 * *pvVar4 + out[j];
      local_38 = local_38 + 1;
    }
    for (; sVar2 = std::vector<float,_std::allocator<float>_>::size(&this->nonzero_coeffs_),
        local_38 < sVar2; local_38 = local_38 + 1) {
      sVar2 = std::vector<float,_std::allocator<float>_>::size(&this->nonzero_coeffs_);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&this->state_,j + ((sVar2 - local_38) + -1) * this->sparsity_);
      fVar1 = *pvVar3;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                         (&this->nonzero_coeffs_,local_38);
      out[j] = fVar1 * *pvVar4 + out[j];
    }
  }
  sVar2 = std::vector<float,_std::allocator<float>_>::size(&this->state_);
  if (sVar2 != 0) {
    sVar2 = std::vector<float,_std::allocator<float>_>::size(&this->state_);
    if (length < sVar2) {
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->state_,0);
      __src = std::vector<float,_std::allocator<float>_>::operator[](&this->state_,length);
      sVar2 = std::vector<float,_std::allocator<float>_>::size(&this->state_);
      memmove(pvVar3,__src,(sVar2 - length) * 4);
      sVar2 = std::vector<float,_std::allocator<float>_>::size(&this->state_);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->state_,sVar2 - length);
      memcpy(pvVar3,in,length << 2);
    }
    else {
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[](&this->state_,0);
      sVar2 = std::vector<float,_std::allocator<float>_>::size(&this->state_);
      sVar5 = std::vector<float,_std::allocator<float>_>::size(&this->state_);
      memcpy(pvVar3,in + (length - sVar2),sVar5 << 2);
    }
  }
  return;
}

Assistant:

void SparseFIRFilter::Filter(const float* in, size_t length, float* out) {
  // Convolves the input signal |in| with the filter kernel |nonzero_coeffs_|
  // taking into account the previous state.
  for (size_t i = 0; i < length; ++i) {
    out[i] = 0.f;
    size_t j;
    for (j = 0; i >= j * sparsity_ + offset_ &&
                j < nonzero_coeffs_.size(); ++j) {
      out[i] += in[i - j * sparsity_ - offset_] * nonzero_coeffs_[j];
    }
    for (; j < nonzero_coeffs_.size(); ++j) {
      out[i] += state_[i + (nonzero_coeffs_.size() - j - 1) * sparsity_] *
                nonzero_coeffs_[j];
    }
  }

  // Update current state.
  if (state_.size() > 0u) {
    if (length >= state_.size()) {
      std::memcpy(&state_[0],
                  &in[length - state_.size()],
                  state_.size() * sizeof(*in));
    } else {
      std::memmove(&state_[0],
                   &state_[length],
                   (state_.size() - length) * sizeof(state_[0]));
      std::memcpy(&state_[state_.size() - length], in, length * sizeof(*in));
    }
  }
}